

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

void PDHG_Init_Variables(CUPDLPwork *work)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  CUPDLPwork *pCVar4;
  cupdlp_float *pcVar5;
  undefined8 *in_RDI;
  CUPDLPvec *aty;
  CUPDLPvec *ax;
  CUPDLPvec *y;
  CUPDLPvec *x;
  cupdlp_int iter;
  CUPDLPiterates *iterates;
  CUPDLPstepsize *stepsize;
  CUPDLPdata *lp;
  CUPDLPproblem *problem;
  cupdlp_float *in_stack_ffffffffffffff88;
  CUPDLPwork *work_00;
  CUPDLPwork *x_00;
  CUPDLPwork *ax_00;
  CUPDLPresobj *w;
  
  piVar2 = *(int **)*in_RDI;
  lVar3 = in_RDI[4];
  pCVar4 = (CUPDLPwork *)in_RDI[3];
  iVar1 = *(int *)in_RDI[6];
  pcVar5 = (&pCVar4->rowScale)[iVar1 % 2];
  w = (&pCVar4[1].resobj)[iVar1 % 2];
  work_00 = pCVar4;
  x_00 = pCVar4;
  ax_00 = pCVar4;
  memset((void *)(&pCVar4->buffer2)[iVar1 % 2][1],0,(long)piVar2[1] << 3);
  PDHG_Project_Bounds(work_00,in_stack_ffffffffffffff88);
  memset((void *)pcVar5[1],0,(long)*piVar2 << 3);
  Ax((CUPDLPwork *)w,(CUPDLPvec *)ax_00,(CUPDLPvec *)x_00);
  ATy((CUPDLPwork *)w,(CUPDLPvec *)ax_00,(CUPDLPvec *)x_00);
  memset(pCVar4->stepsize,0,(long)piVar2[1] << 3);
  memset(pCVar4->scaling,0,(long)*piVar2 << 3);
  memset((void *)(pCVar4[1].stepsize)->dPrimalStep,0,(long)piVar2[1] << 3);
  memset((pCVar4[1].scaling)->rowScale,0,(long)*piVar2 << 3);
  PDHG_Project_Bounds(work_00,in_stack_ffffffffffffff88);
  PDHG_Project_Bounds(work_00,in_stack_ffffffffffffff88);
  *(undefined8 *)(lVar3 + 0x18) = 0;
  *(undefined8 *)(lVar3 + 0x20) = 0;
  memset(pCVar4->timers,0,(long)piVar2[1] << 3);
  memset(pCVar4->buffer,0,(long)*piVar2 << 3);
  return;
}

Assistant:

void PDHG_Init_Variables(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;

  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];

  CUPDLP_ZERO_VEC(x->data, cupdlp_float, lp->nCols);

  // XXX: PDLP Does not project x0,  so we uncomment for 1-1 comparison

  PDHG_Project_Bounds(work, x->data);

  // cupdlp_zero(iterates->y, cupdlp_float, lp->nRows);
  CUPDLP_ZERO_VEC(y->data, cupdlp_float, lp->nRows);

  // Ax(work, iterates->ax, iterates->x);
  // ATyCPU(work, iterates->aty, iterates->y);
  Ax(work, ax, x);
  ATy(work, aty, y);

  // cupdlp_zero(iterates->xSum, cupdlp_float, lp->nCols);
  // cupdlp_zero(iterates->ySum, cupdlp_float, lp->nRows);
  // cupdlp_zero(iterates->xAverage, cupdlp_float, lp->nCols);
  // cupdlp_zero(iterates->yAverage, cupdlp_float, lp->nRows);
  CUPDLP_ZERO_VEC(iterates->xSum, cupdlp_float, lp->nCols);
  CUPDLP_ZERO_VEC(iterates->ySum, cupdlp_float, lp->nRows);
  CUPDLP_ZERO_VEC(iterates->xAverage->data, cupdlp_float, lp->nCols);
  CUPDLP_ZERO_VEC(iterates->yAverage->data, cupdlp_float, lp->nRows);

  PDHG_Project_Bounds(work, iterates->xSum);
  PDHG_Project_Bounds(work, iterates->xAverage->data);

  stepsize->dSumPrimalStep = 0.0;
  stepsize->dSumDualStep = 0.0;

  CUPDLP_ZERO_VEC(iterates->xLastRestart, cupdlp_float, lp->nCols);
  CUPDLP_ZERO_VEC(iterates->yLastRestart, cupdlp_float, lp->nRows);
}